

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

void Sbd_StoRefObj(Sbd_Sto_t *p,int iObj,int iMirror)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  
  if (iObj < 0) {
LAB_005457d0:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->pGia->nObjs <= iObj) goto LAB_005457d0;
  if (p->vRefs->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vRefs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f1,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  if (iObj <= iMirror) {
    __assert_fail("iMirror < iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f2,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  pGVar4 = p->pGia->pObjs;
  Vec_IntPush(p->vRefs,0);
  if (0 < iMirror) {
    pVVar5 = p->vRefs;
    if (pVVar5->nSize <= iMirror) goto LAB_005457b1;
    if ((uint)pVVar5->nSize <= (uint)iObj) {
LAB_005457ef:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    piVar8 = pVVar5->pArray;
    piVar8[(uint)iObj] = piVar8[(uint)iMirror];
    if (pVVar5->nSize <= iMirror) goto LAB_005457ef;
    piVar8[(uint)iMirror] = 1;
  }
  uVar6 = *(ulong *)(pGVar4 + (uint)iObj);
  uVar9 = (uint)uVar6;
  if ((uVar6 & 0x1fffffff) == 0x1fffffff || (int)uVar9 < 0) {
    if (-1 < (int)uVar9 || (int)(uVar6 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    uVar9 = iObj - (uVar9 & 0x1fffffff);
    if ((-1 < (int)uVar9) && ((int)uVar9 < p->vMirrors->nSize)) {
      if (p->vMirrors->pArray[uVar9] != -1) {
        __assert_fail("Lit0m == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                      ,0x306,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
      }
      if ((int)uVar9 < p->vRefs->nSize) {
        piVar8 = p->vRefs->pArray + uVar9;
LAB_005457a6:
        *piVar8 = *piVar8 + 1;
        return;
      }
LAB_0054580e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
  else {
    uVar9 = iObj - (uVar9 & 0x1fffffff);
    if (-1 < (int)uVar9) {
      uVar2 = p->vMirrors->nSize;
      if ((((int)uVar9 < (int)uVar2) &&
          (uVar10 = iObj - ((uint)(uVar6 >> 0x20) & 0x1fffffff), -1 < (int)uVar10)) &&
         (uVar10 < uVar2)) {
        piVar8 = p->vMirrors->pArray;
        uVar2 = piVar8[uVar9];
        uVar3 = piVar8[uVar10];
        uVar7 = uVar2 >> 1;
        if ((int)uVar2 < 0) {
          uVar7 = uVar9;
        }
        uVar9 = uVar3 >> 1;
        if ((int)uVar3 < 0) {
          uVar9 = uVar10;
        }
        pVVar5 = p->vRefs;
        if ((int)uVar7 < pVVar5->nSize) {
          piVar8 = pVVar5->pArray;
          piVar1 = piVar8 + uVar7;
          *piVar1 = *piVar1 + 1;
          if ((int)uVar9 < pVVar5->nSize) {
            piVar8 = piVar8 + uVar9;
            goto LAB_005457a6;
          }
        }
        goto LAB_0054580e;
      }
    }
  }
LAB_005457b1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_StoRefObj( Sbd_Sto_t * p, int iObj, int iMirror )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    assert( iObj == Vec_IntSize(p->vRefs) );
    assert( iMirror < iObj );
    Vec_IntPush( p->vRefs, 0 );
//printf( "Ref %d\n", iObj );
    if ( iMirror > 0 )
    {
        Vec_IntWriteEntry( p->vRefs, iObj, Vec_IntEntry(p->vRefs, iMirror) );
        Vec_IntWriteEntry( p->vRefs, iMirror, 1 );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        int Lit1m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        int Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        int Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Vec_IntAddToEntry( p->vRefs, Fan0, 1 );
        Vec_IntAddToEntry( p->vRefs, Fan1, 1 );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        assert( Lit0m == -1 );
        Vec_IntAddToEntry( p->vRefs, Gia_ObjFaninId0(pObj, iObj), 1 );
    }
}